

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseUnits(LEFReader *this)

{
  bool bVar1;
  token_t tVar2;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0 [2];
  invalid_argument *ia;
  double micronsd;
  string local_70;
  allocator<char> local_39;
  string local_38;
  LEFReader *local_18;
  LEFReader *this_local;
  
  local_18 = this;
  tVar2 = tokenize(this,&this->m_tokstr);
  this->m_curtok = tVar2;
  if (this->m_curtok == TOK_EOL) {
    while( true ) {
      tVar2 = tokenize(this,&this->m_tokstr);
      this->m_curtok = tVar2;
      if (this->m_curtok != TOK_IDENT) break;
      bVar1 = std::operator==(&this->m_tokstr,"DATABASE");
      if (bVar1) {
        tVar2 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar2;
        if ((this->m_curtok != TOK_IDENT) ||
           (bVar1 = std::operator==(&this->m_tokstr,"MICRONS"), !bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"Expects MICRONS keywords after DATABASE\n",&local_149);
          error(this,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator(&local_149);
          return false;
        }
        tVar2 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar2;
        if (this->m_curtok != TOK_NUMBER) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"Expected a number after DATABASE MICRONS\n",&local_121);
          error(this,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
          return false;
        }
        ia = (invalid_argument *)std::__cxx11::stod(&this->m_tokstr,(size_t *)0x0);
        tVar2 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar2;
        if (this->m_curtok != TOK_SEMICOL) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d0,"Expected ; after DATABASE MICRONS <number>\n",&local_d1);
          error(this,local_d0);
          std::__cxx11::string::~string((string *)local_d0);
          std::allocator<char>::~allocator(&local_d1);
          return false;
        }
        tVar2 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar2;
        if (this->m_curtok != TOK_EOL) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"Expected EOL after DATABASE MICRONS <number> ;\n",
                     &local_f9);
          error(this,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator(&local_f9);
          return false;
        }
        (*this->_vptr_LEFReader[0x14])(ia);
      }
      else {
        bVar1 = std::operator==(&this->m_tokstr,"END");
        if (bVar1) {
          tVar2 = tokenize(this,&this->m_tokstr);
          this->m_curtok = tVar2;
          if ((this->m_curtok == TOK_IDENT) &&
             (bVar1 = std::operator==(&this->m_tokstr,"UNITS"), bVar1)) {
            return true;
          }
          while( true ) {
            bVar1 = false;
            if (this->m_curtok != TOK_EOL) {
              bVar1 = this->m_curtok != TOK_EOF;
            }
            if (!bVar1) break;
            tVar2 = tokenize(this,&this->m_tokstr);
            this->m_curtok = tVar2;
          }
        }
        else {
          while( true ) {
            bVar1 = false;
            if (this->m_curtok != TOK_EOL) {
              bVar1 = this->m_curtok != TOK_EOF;
            }
            if (!bVar1) break;
            tVar2 = tokenize(this,&this->m_tokstr);
            this->m_curtok = tVar2;
          }
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Expected string in units block\n",
               (allocator<char> *)((long)&micronsd + 7));
    error(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&micronsd + 7));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Expected EOL after UNITS\n",&local_39);
    error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return false;
}

Assistant:

bool LEFReader::parseUnits()
{
    // UNITS
    //   DATABASE MICRONS ;
    //   ...
    // END UNITS

    // expect EOL after UNITS

    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL after UNITS\n");
        return false;
    }

    while(1)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok != TOK_IDENT)
        {
            error("Expected string in units block\n");
            return false;
        }

        if (m_tokstr == "DATABASE")
        {
            m_curtok = tokenize(m_tokstr);
            if ((m_curtok == TOK_IDENT) && (m_tokstr == "MICRONS"))
            {
                m_curtok = tokenize(m_tokstr);
                if (m_curtok == TOK_NUMBER)
                {
                    double micronsd;
                    try
                    {
                        micronsd = std::stod(m_tokstr);
                    }
                    catch(const std::invalid_argument& ia)
                    {
                        error(ia.what());
                        return false;
                    }

                    // expect ; and EOL
                    m_curtok = tokenize(m_tokstr);
                    if (m_curtok != TOK_SEMICOL)
                    {
                        error("Expected ; after DATABASE MICRONS <number>\n");
                        return false;
                    }

                    m_curtok = tokenize(m_tokstr);
                    if (m_curtok != TOK_EOL)
                    {
                        error("Expected EOL after DATABASE MICRONS <number> ;\n");
                        return false;
                    }

                    onDatabaseUnitsMicrons(micronsd);
                }
                else
                {
                    error("Expected a number after DATABASE MICRONS\n");
                    return false;
                }
            }
            else
            {
                error("Expects MICRONS keywords after DATABASE\n");
                return false;
            }
        }
        else if (m_tokstr == "END")
        {
            // check for units
            m_curtok = tokenize(m_tokstr);
            if ((m_curtok == TOK_IDENT) && (m_tokstr == "UNITS"))
            {
                return true;
            }
            else
            {
                // read until EOL
                while ((m_curtok != TOK_EOL) && (m_curtok != TOK_EOF))
                {
                    m_curtok = tokenize(m_tokstr);
                }
            }
        }
        else
        {
            // got something other than DATABASE or END
            // read until EOL
            while ((m_curtok != TOK_EOL) && (m_curtok != TOK_EOF))
            {
                m_curtok = tokenize(m_tokstr);
            }
        }
    }
}